

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O2

void __thiscall
absl::inlined_vector_internal::
Storage<absl::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::str_format_internal::FormatArgImpl>_>
::~Storage(Storage<absl::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::str_format_internal::FormatArgImpl>_>
           *this)

{
  if ((this->metadata_).
      super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::allocator<absl::str_format_internal::FormatArgImpl>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
      .super_Storage<unsigned_long,_1UL,_false>.value != 0) {
    DeallocateIfAllocated(this);
  }
  return;
}

Assistant:

~Storage() {
    // Fast path: if we are empty and not allocated, there's nothing to do.
    if (GetSizeAndIsAllocated() == 0) {
      return;
    }

    // Fast path: if no destructors need to be run and we know the allocator
    // doesn't do anything fancy, then all we need to do is deallocate (and
    // maybe not even that).
    if (absl::is_trivially_destructible<ValueType<A>>::value &&
        std::is_same<A, std::allocator<ValueType<A>>>::value) {
      DeallocateIfAllocated();
      return;
    }

    DestroyContents();
  }